

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void BrotliStoreMetaBlockFast
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Command *pCVar4;
  uint16_t local_2d88 [4];
  uint16_t dist_bits [140];
  uint8_t local_2c68 [8];
  uint8_t dist_depth [140];
  uint16_t cmd_bits [704];
  uint8_t cmd_depth [704];
  uint16_t lit_bits_1 [256];
  uint8_t lit_depth_1 [256];
  undefined1 local_2090 [8];
  HistogramDistance dist_histo;
  HistogramCommand cmd_histo;
  HistogramLiteral lit_histo;
  size_t j;
  Command cmd;
  uint16_t lit_bits [256];
  uint8_t lit_depth [256];
  ulong local_5c0;
  size_t i;
  size_t num_literals;
  size_t pos;
  uint32_t histogram [256];
  uint32_t distance_alphabet_bits;
  uint32_t num_distance_symbols;
  int is_last_local;
  size_t mask_local;
  size_t length_local;
  size_t start_pos_local;
  uint8_t *input_local;
  MemoryManager *m_local;
  uint64_t v;
  uint8_t *p;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v_3;
  uint8_t *p_3;
  
  uVar3 = (params->dist).alphabet_size_max - 1;
  iVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  histogram[0xff] = iVar2 + 1;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  *(ulong *)(storage + (*storage_ix >> 3)) =
       0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = *storage_ix + 0xd;
  if (n_commands < 0x81) {
    memset(&pos,0,0x400);
    i = 0;
    num_literals = start_pos;
    for (local_5c0 = 0; local_5c0 < n_commands; local_5c0 = local_5c0 + 1) {
      pCVar4 = commands + local_5c0;
      uVar1._0_4_ = pCVar4->insert_len_;
      uVar1._4_4_ = pCVar4->copy_len_;
      cmd._0_8_ = *(undefined8 *)&pCVar4->dist_extra_;
      for (lit_histo.bit_cost_ = (double)(uVar1 & 0xffffffff); lit_histo.bit_cost_ != 0.0;
          lit_histo.bit_cost_ = (double)((long)lit_histo.bit_cost_ + -1)) {
        histogram[(ulong)input[num_literals & mask] - 2] =
             histogram[(ulong)input[num_literals & mask] - 2] + 1;
        num_literals = num_literals + 1;
      }
      i = (uVar1 & 0xffffffff) + i;
      num_literals = (uVar1._4_4_ & 0x1ffffff) + num_literals;
    }
    BrotliBuildAndStoreHuffmanTreeFast
              (m,(uint32_t *)&pos,i,8,(uint8_t *)(lit_bits + 0xfc),(uint16_t *)&cmd.dist_extra_,
               storage_ix,storage);
    *(ulong *)(storage + (*storage_ix >> 3)) =
         0x92624416307003 << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 0x38;
    *(ulong *)(storage + (*storage_ix >> 3)) =
         0L << ((byte)*storage_ix & 7) | (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 3;
    *(ulong *)(storage + (*storage_ix >> 3)) =
         0x369dc03L << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = *storage_ix + 0x1c;
    StoreDataWithHuffmanCodes
              (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_bits + 0xfc),
               (uint16_t *)&cmd.dist_extra_,
               "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v"
               ,kStaticCommandCodeBits,
               "\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06"
               ,kStaticDistanceCodeBits,storage_ix,storage);
  }
  else {
    memset(&cmd_histo.bit_cost_,0,0x400);
    memset(&dist_histo.bit_cost_,0,0xb00);
    cmd_histo.data_[0x2be] = 0;
    cmd_histo.data_[0x2bf] = 0;
    cmd_histo.total_count_ = 0x7ff0000000000000;
    memset(local_2090,0,0x880);
    dist_histo.data_[0x21e] = 0;
    dist_histo.data_[0x21f] = 0;
    dist_histo.total_count_ = 0x7ff0000000000000;
    BuildHistograms(input,start_pos,mask,commands,n_commands,
                    (HistogramLiteral *)&cmd_histo.bit_cost_,
                    (HistogramCommand *)&dist_histo.bit_cost_,(HistogramDistance *)local_2090);
    BrotliBuildAndStoreHuffmanTreeFast
              (m,(uint32_t *)&cmd_histo.bit_cost_,lit_histo.data_._1016_8_,8,
               (uint8_t *)(lit_bits_1 + 0xfc),(uint16_t *)(cmd_depth + 0x2b8),storage_ix,storage);
    BrotliBuildAndStoreHuffmanTreeFast
              (m,(uint32_t *)&dist_histo.bit_cost_,cmd_histo.data_._2808_8_,10,
               (uint8_t *)(cmd_bits + 700),(uint16_t *)(dist_depth + 0x88),storage_ix,storage);
    BrotliBuildAndStoreHuffmanTreeFast
              (m,(uint32_t *)local_2090,dist_histo.data_._2168_8_,(ulong)histogram[0xff],local_2c68,
               local_2d88,storage_ix,storage);
    StoreDataWithHuffmanCodes
              (input,start_pos,mask,commands,n_commands,(uint8_t *)(lit_bits_1 + 0xfc),
               (uint16_t *)(cmd_depth + 0x2b8),(uint8_t *)(cmd_bits + 700),
               (uint16_t *)(dist_depth + 0x88),local_2c68,local_2d88,storage_ix,storage);
  }
  if (is_last != 0) {
    JumpToByteBoundary(storage_ix,storage);
  }
  return;
}

Assistant:

void BrotliStoreMetaBlockFast(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  uint32_t distance_alphabet_bits =
      Log2FloorNonZero(num_distance_symbols - 1) + 1;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  BrotliWriteBits(13, 0, storage_ix, storage);

  if (n_commands <= 128) {
    uint32_t histogram[BROTLI_NUM_LITERAL_SYMBOLS] = { 0 };
    size_t pos = start_pos;
    size_t num_literals = 0;
    size_t i;
    uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
    uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
    for (i = 0; i < n_commands; ++i) {
      const Command cmd = commands[i];
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        ++histogram[input[pos & mask]];
        ++pos;
      }
      num_literals += cmd.insert_len_;
      pos += CommandCopyLen(&cmd);
    }
    BrotliBuildAndStoreHuffmanTreeFast(m, histogram, num_literals,
                                       /* max_bits = */ 8,
                                       lit_depth, lit_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    StoreStaticCommandHuffmanTree(storage_ix, storage);
    StoreStaticDistanceHuffmanTree(storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, lit_depth, lit_bits,
                              kStaticCommandCodeDepth,
                              kStaticCommandCodeBits,
                              kStaticDistanceCodeDepth,
                              kStaticDistanceCodeBits,
                              storage_ix, storage);
  } else {
    HistogramLiteral lit_histo;
    HistogramCommand cmd_histo;
    HistogramDistance dist_histo;
    uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
    uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
    uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS];
    uint16_t cmd_bits[BROTLI_NUM_COMMAND_SYMBOLS];
    uint8_t dist_depth[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
    uint16_t dist_bits[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
    HistogramClearLiteral(&lit_histo);
    HistogramClearCommand(&cmd_histo);
    HistogramClearDistance(&dist_histo);
    BuildHistograms(input, start_pos, mask, commands, n_commands,
                    &lit_histo, &cmd_histo, &dist_histo);
    BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo.data_,
                                       lit_histo.total_count_,
                                       /* max_bits = */ 8,
                                       lit_depth, lit_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    BrotliBuildAndStoreHuffmanTreeFast(m, cmd_histo.data_,
                                       cmd_histo.total_count_,
                                       /* max_bits = */ 10,
                                       cmd_depth, cmd_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    BrotliBuildAndStoreHuffmanTreeFast(m, dist_histo.data_,
                                       dist_histo.total_count_,
                                       /* max_bits = */
                                       distance_alphabet_bits,
                                       dist_depth, dist_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, lit_depth, lit_bits,
                              cmd_depth, cmd_bits,
                              dist_depth, dist_bits,
                              storage_ix, storage);
  }

  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}